

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::DuckDBAPISetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  InvalidInputException *this;
  string new_value;
  string local_60;
  string local_40;
  
  Value::GetValue<std::__cxx11::string>(&local_40,input);
  if (db == (DatabaseInstance *)0x0) {
    ::std::__cxx11::string::_M_assign((string *)&(config->options).duckdb_api);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Cannot change duckdb_api setting while database is running","");
  InvalidInputException::InvalidInputException(this,&local_60);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckDBAPISetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto new_value = input.GetValue<string>();
	if (db) {
		throw InvalidInputException("Cannot change duckdb_api setting while database is running");
	}
	config.options.duckdb_api = new_value;
}